

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.c
# Opt level: O3

void __thiscall Sparse_matrix_Apply_to_vector(void *this,double *vector,double *newVector)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  uVar1 = *this;
  if ((ulong)uVar1 != 0) {
    puVar3 = *(uint **)((long)this + 8);
    lVar4 = *(long *)((long)this + 0x10);
    uVar5 = 0;
    uVar6 = (ulong)*puVar3;
    do {
      dVar7 = *(double *)(lVar4 + uVar5 * 8) * vector[uVar5];
      newVector[uVar5] = dVar7;
      uVar2 = puVar3[uVar5 + 1];
      if ((uint)uVar6 < uVar2) {
        do {
          dVar7 = dVar7 + *(double *)(lVar4 + uVar6 * 8) * vector[puVar3[uVar6]];
          newVector[uVar5] = dVar7;
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
      }
      uVar5 = uVar5 + 1;
      uVar6 = (ulong)uVar2;
    } while (uVar5 != uVar1);
  }
  return;
}

Assistant:

void Sparse_matrix_Apply_to_vector (
    Sparse_matrix const * this,
    double const * vector,
    double * newVector) {

  register unsigned i, ind;
  
  for (i = 0; i < this->size; ++i) {
    newVector[i] = this->elements[i] * vector[i];
    for (ind = this->indices[i]; ind < this->indices[i+1]; ++ind) {
      newVector[i] += this->elements[ind] * vector[this->indices[ind]];
    }
  }
}